

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_searcher.cc
# Opt level: O1

bool __thiscall
gss::innards::HomomorphismSearcher::propagate
          (HomomorphismSearcher *this,bool initial,Domains *new_domains,
          HomomorphismAssignments *assignments,bool propagate_using_lackey)

{
  size_t *psVar1;
  uint *puVar2;
  pointer *ppHVar3;
  uint uVar4;
  size_t sVar5;
  undefined1 (*pauVar6) [16];
  HomomorphismAssignmentInformation *pHVar7;
  undefined8 uVar8;
  pointer pHVar9;
  iterator __position;
  Proof *this_00;
  pointer pHVar10;
  Lackey *this_01;
  byte bVar11;
  undefined1 auVar12 [16];
  uint uVar13;
  bool bVar14;
  HomomorphismDomain *d;
  pointer pHVar15;
  __normal_iterator<const_gss::innards::HomomorphismAssignmentInformation_*,_std::vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>_>
  _Var16;
  _List_node_base *p_Var17;
  pointer pHVar18;
  pointer pHVar19;
  uint uVar20;
  int iVar21;
  SVOBitset *pSVar22;
  ulong uVar23;
  long lVar24;
  undefined7 in_register_00000031;
  ulong uVar25;
  undefined7 in_register_00000081;
  BitWord *b_1;
  _Self __tmp;
  pointer plVar26;
  pointer plVar27;
  pointer plVar28;
  _Node_alloc_type *__alloc;
  undefined8 *puVar29;
  bool bVar30;
  vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
  *__range2;
  bool wipeout;
  optional<gss::innards::HomomorphismAssignment> current_assignment;
  int dcount;
  VertexToVertexMapping mapping;
  byte local_f2;
  byte local_f1;
  Domains *local_f0;
  allocator_type local_e1;
  ulong local_e0;
  undefined4 local_d4;
  pointer local_d0;
  HomomorphismSearcher *local_c8;
  pointer local_c0;
  _Storage<gss::innards::HomomorphismAssignment,_true> local_b8;
  undefined1 local_b0;
  long local_a8;
  pointer local_a0;
  _Storage<gss::innards::HomomorphismAssignment,_true> local_98;
  undefined4 local_8c;
  _Any_data local_88;
  code *pcStack_78;
  code *apcStack_70 [2];
  _Storage<gss::innards::HomomorphismAssignment,_true> local_60;
  _Rb_tree_color _Stack_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined8 local_38;
  
  local_d4 = (undefined4)CONCAT71(in_register_00000081,propagate_using_lackey);
  local_f0 = new_domains;
  local_c8 = this;
  if (((int)CONCAT71(in_register_00000031,initial) != 0) &&
     (bVar14 = might_have_watches(this->params), bVar14)) {
    pHVar15 = (assignments->values).
              super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_a0 = (assignments->values).
               super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    bVar14 = pHVar15 == local_a0;
    while (!bVar14) {
      uVar20 = (pHVar15->assignment).pattern_vertex;
      uVar4 = (pHVar15->assignment).target_vertex;
      local_c0 = (pointer)CONCAT44(local_c0._4_4_,uVar20);
      local_98._M_value.pattern_vertex = uVar4;
      plVar27 = (this->watches).table.data.
                super__Vector_base<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>,_std::allocator<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start +
                ((this->watches).table.target_size * uVar20 + uVar4);
      plVar28 = *(pointer *)
                 &(plVar27->
                  super__List_base<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>
                  )._M_impl._M_node;
      local_f1 = bVar14;
      local_d0 = pHVar15;
      if (plVar28 != plVar27) {
        local_e0 = local_e0 & 0xffffffff00000000;
        do {
          sVar5 = *(size_t *)
                   ((long)&(plVar28->
                           super__List_base<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>
                           )._M_impl._M_node + 0x10);
          pauVar6 = *(undefined1 (**) [16])(sVar5 + 0x10);
          if ((*(int *)*pauVar6 != (int)local_c0) || (*(uint *)(*pauVar6 + 4) != local_98._0_4_)) {
            auVar12 = vpermilps_avx(*pauVar6,0x4e);
            *pauVar6 = auVar12;
          }
          for (puVar29 = (undefined8 *)(*(long *)(sVar5 + 0x10) + 0x10);
              puVar29 != *(undefined8 **)(sVar5 + 0x18); puVar29 = puVar29 + 1) {
            pHVar7 = (assignments->values).
                     super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            _Var16 = std::
                     __find_if<__gnu_cxx::__normal_iterator<gss::innards::HomomorphismAssignmentInformation_const*,std::vector<gss::innards::HomomorphismAssignmentInformation,std::allocator<gss::innards::HomomorphismAssignmentInformation>>>,__gnu_cxx::__ops::_Iter_pred<gss::innards::HomomorphismAssignments::contains(gss::innards::HomomorphismAssignment_const&)const::_lambda(auto:1_const&)_1_>>
                               ((assignments->values).
                                super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
                                ._M_impl.super__Vector_impl_data._M_start,pHVar7,puVar29);
            if (pHVar7 == _Var16._M_current) {
              uVar8 = **(undefined8 **)(sVar5 + 0x10);
              **(undefined8 **)(sVar5 + 0x10) = *puVar29;
              *puVar29 = uVar8;
              uVar8 = **(undefined8 **)(sVar5 + 0x10);
              uVar20 = (local_c8->watches).table.target_size;
              plVar26 = (local_c8->watches).table.data.
                        super__Vector_base<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>,_std::allocator<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              p_Var17 = (_List_node_base *)operator_new(0x18);
              p_Var17[1]._M_next =
                   *(_List_node_base **)
                    ((long)&(plVar28->
                            super__List_base<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>
                            )._M_impl._M_node + 0x10);
              std::__detail::_List_node_base::_M_hook(p_Var17);
              psVar1 = (size_t *)
                       ((long)&plVar26[uVar20 * (int)uVar8 + (int)((ulong)uVar8 >> 0x20)].
                               super__List_base<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>
                               ._M_impl._M_node + 0x10);
              *psVar1 = *psVar1 + 1;
              plVar26 = *(pointer *)
                         &(plVar28->
                          super__List_base<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>
                          )._M_impl._M_node;
              psVar1 = (size_t *)
                       ((long)&(plVar27->
                               super__List_base<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>
                               )._M_impl._M_node + 0x10);
              *psVar1 = *psVar1 - 1;
              std::__detail::_List_node_base::_M_unhook();
              operator_delete(plVar28,0x18);
              goto LAB_00133843;
            }
          }
          pHVar18 = (local_f0->
                    super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pHVar9 = (local_f0->
                   super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          if (pHVar18 != pHVar9) {
            do {
              if (pHVar18->v == *(uint *)(*(long *)(sVar5 + 0x10) + 8)) {
                if ((pHVar18->values).n_words < 0x11) {
                  pSVar22 = &pHVar18->values;
                }
                else {
                  pSVar22 = (SVOBitset *)(pHVar18->values)._data.short_data[0];
                }
                uVar20 = *(uint *)(*(long *)(sVar5 + 0x10) + 0xc);
                uVar4 = uVar20 + 0x3f;
                if (-1 < (int)uVar20) {
                  uVar4 = uVar20;
                }
                if (((pSVar22->_data).short_data[(int)uVar4 >> 6] >> ((ulong)uVar20 & 0x3f) & 1) !=
                    0) {
                  (pSVar22->_data).short_data[(int)uVar4 >> 6] =
                       ~(1L << ((ulong)uVar20 & 0x3f)) &
                       (pSVar22->_data).short_data[(int)uVar4 >> 6];
                  puVar2 = &pHVar18->count;
                  *puVar2 = *puVar2 - 1;
                  uVar20 = (uint)local_e0 & 0xff;
                  if (*puVar2 == 0) {
                    uVar20 = 1;
                  }
                  local_e0 = CONCAT44(local_e0._4_4_,uVar20);
                }
                break;
              }
              pHVar18 = pHVar18 + 1;
            } while (pHVar18 != pHVar9);
          }
          plVar26 = *(pointer *)
                     &(plVar28->
                      super__List_base<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>
                      )._M_impl._M_node;
LAB_00133843:
          plVar28 = plVar26;
        } while (plVar26 != plVar27);
        this = local_c8;
        if ((local_e0 & 1) != 0) {
          if ((local_f1 & 1) == 0) {
            return false;
          }
          break;
        }
      }
      pHVar15 = local_d0 + 1;
      bVar14 = pHVar15 == local_a0;
    }
  }
  pHVar18 = (local_f0->
            super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pHVar9 = (local_f0->
           super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar24 = ((long)pHVar9 - (long)pHVar18 >> 3) * -0x79435e50d79435e5 >> 2;
  pHVar19 = pHVar18;
  if (0 < lVar24) {
    pHVar19 = pHVar18 + lVar24 * 4;
    lVar24 = lVar24 + 1;
    pHVar18 = pHVar18 + 2;
    do {
      if ((pHVar18[-2].fixed == false) && (pHVar18[-2].count == 1)) {
        pHVar18 = pHVar18 + -2;
        goto LAB_00133991;
      }
      if ((pHVar18[-1].fixed == false) && (pHVar18[-1].count == 1)) {
        pHVar18 = pHVar18 + -1;
        goto LAB_00133991;
      }
      if ((pHVar18->fixed == false) && (pHVar18->count == 1)) goto LAB_00133991;
      if ((pHVar18[1].fixed == false) && (pHVar18[1].count == 1)) {
        pHVar18 = pHVar18 + 1;
        goto LAB_00133991;
      }
      lVar24 = lVar24 + -1;
      pHVar18 = pHVar18 + 4;
    } while (1 < lVar24);
  }
  lVar24 = ((long)pHVar9 - (long)pHVar19 >> 3) * -0x79435e50d79435e5;
  if (lVar24 != 1) {
    if (lVar24 != 2) {
      pHVar18 = pHVar9;
      if ((lVar24 != 3) || ((pHVar19->fixed == false && (pHVar18 = pHVar19, pHVar19->count == 1))))
      goto LAB_00133991;
      pHVar19 = pHVar19 + 1;
    }
    if ((pHVar19->fixed == false) && (pHVar18 = pHVar19, pHVar19->count == 1)) goto LAB_00133991;
    pHVar19 = pHVar19 + 1;
  }
  pHVar18 = pHVar19;
  if (pHVar19->count != 1) {
    pHVar18 = pHVar9;
  }
  if (pHVar19->fixed != false) {
    pHVar18 = pHVar9;
  }
LAB_00133991:
  bVar14 = pHVar18 ==
           (local_f0->
           super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_a0 = (pointer)&this->proof;
  pHVar15 = (pointer)0x0;
LAB_001339a9:
  local_b0 = 0;
  if (!bVar14) {
    uVar23 = (ulong)(pHVar18->values).n_words;
    if (uVar23 < 0x11) {
      pSVar22 = &pHVar18->values;
    }
    else {
      pSVar22 = (SVOBitset *)(pHVar18->values)._data.short_data[0];
    }
    uVar25 = 0xffffffff00000000;
    if (uVar23 != 0) {
      lVar24 = 0;
LAB_001339e2:
      uVar25 = (pSVar22->_data).short_data[0];
      if (uVar25 == 0) goto code_r0x001339ea;
      uVar20 = 0;
      for (; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
        uVar20 = uVar20 + 1;
      }
      uVar25 = (ulong)(uVar20 | (uint)lVar24) << 0x20;
    }
    goto LAB_00133a11;
  }
  goto LAB_00133d33;
code_r0x001339ea:
  lVar24 = lVar24 + 0x40;
  pSVar22 = (SVOBitset *)((long)&pSVar22->_data + 8);
  if (uVar23 << 6 == lVar24) goto code_r0x001339f7;
  goto LAB_001339e2;
code_r0x001339f7:
  uVar25 = 0xffffffff00000000;
LAB_00133a11:
  local_b8 = (_Storage<gss::innards::HomomorphismAssignment,_true>)(pHVar18->v | uVar25);
  local_b0 = 1;
  pHVar18->fixed = true;
  _Stack_58 = _Stack_58 & 0xffffff00;
  uStack_54 = 0xffffffff;
  uStack_50 = 0xffffffff;
  __position._M_current =
       (assignments->values).
       super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_d0 = pHVar15;
  local_60 = local_b8;
  if (__position._M_current ==
      (assignments->values).
      super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
    ::_M_realloc_insert<gss::innards::HomomorphismAssignmentInformation>
              (&assignments->values,__position,
               (HomomorphismAssignmentInformation *)&local_60._M_value);
  }
  else {
    (__position._M_current)->choice_count = -1;
    (__position._M_current)->assignment = (HomomorphismAssignment)local_b8;
    (__position._M_current)->is_decision = (bool)(char)_Stack_58;
    *(int3 *)&(__position._M_current)->field_0x9 = (int3)(_Stack_58 >> 8);
    (__position._M_current)->discrepancy_count = 0xffffffff;
    ppHVar3 = &(assignments->values).
               super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppHVar3 = *ppHVar3 + 1;
  }
  this_00 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  if (this_00 != (Proof *)0x0) {
    HomomorphismModel::pattern_vertex_for_proof_abi_cxx11_
              ((NamedVertex *)&local_60._M_value,this->model,local_b8._M_value.pattern_vertex);
    HomomorphismModel::target_vertex_for_proof_abi_cxx11_
              ((NamedVertex *)&local_88,this->model,local_b8._M_value.target_vertex);
    Proof::unit_propagating(this_00,(NamedVertex *)&local_60._M_value,(NamedVertex *)&local_88);
    if ((code **)local_88._8_8_ != apcStack_70) {
      operator_delete((void *)local_88._8_8_,(ulong)(apcStack_70[0] + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(uStack_54,_Stack_58) != &local_48) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(uStack_54,_Stack_58),local_48._M_allocated_capacity + 1);
    }
  }
  bVar14 = might_have_watches(this->params);
  if (bVar14) {
    local_e0 = (ulong)local_b8 >> 0x20;
    local_98._M_value = local_b8._M_value;
    local_c0 = (this->watches).table.data.
               super__Vector_base<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>,_std::allocator<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start +
               ((this->watches).table.target_size * local_b8._M_value.pattern_vertex +
               local_b8._M_value.target_vertex);
    plVar27 = *(pointer *)
               &(local_c0->
                super__List_base<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>
                )._M_impl._M_node;
    if (plVar27 == local_c0) goto LAB_00133d18;
    bVar30 = false;
    bVar14 = false;
    do {
      sVar5 = *(size_t *)
               ((long)&(plVar27->
                       super__List_base<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>
                       )._M_impl._M_node + 0x10);
      pauVar6 = *(undefined1 (**) [16])(sVar5 + 0x10);
      if ((*(uint *)*pauVar6 != local_98._M_value.pattern_vertex) ||
         (*(int *)(*pauVar6 + 4) != (int)local_e0)) {
        auVar12 = vpermilps_avx(*pauVar6,0x4e);
        *pauVar6 = auVar12;
      }
      for (puVar29 = (undefined8 *)(*(long *)(sVar5 + 0x10) + 0x10);
          puVar29 != *(undefined8 **)(sVar5 + 0x18); puVar29 = puVar29 + 1) {
        pHVar7 = (assignments->values).
                 super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        _Var16 = std::
                 __find_if<__gnu_cxx::__normal_iterator<gss::innards::HomomorphismAssignmentInformation_const*,std::vector<gss::innards::HomomorphismAssignmentInformation,std::allocator<gss::innards::HomomorphismAssignmentInformation>>>,__gnu_cxx::__ops::_Iter_pred<gss::innards::HomomorphismAssignments::contains(gss::innards::HomomorphismAssignment_const&)const::_lambda(auto:1_const&)_1_>>
                           ((assignments->values).
                            super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
                            ._M_impl.super__Vector_impl_data._M_start,pHVar7,puVar29);
        if (pHVar7 == _Var16._M_current) {
          uVar8 = **(undefined8 **)(sVar5 + 0x10);
          **(undefined8 **)(sVar5 + 0x10) = *puVar29;
          *puVar29 = uVar8;
          uVar8 = **(undefined8 **)(sVar5 + 0x10);
          uVar20 = (local_c8->watches).table.target_size;
          plVar28 = (local_c8->watches).table.data.
                    super__Vector_base<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>,_std::allocator<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          p_Var17 = (_List_node_base *)operator_new(0x18);
          p_Var17[1]._M_next =
               *(_List_node_base **)
                ((long)&(plVar27->
                        super__List_base<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>
                        )._M_impl._M_node + 0x10);
          std::__detail::_List_node_base::_M_hook(p_Var17);
          psVar1 = (size_t *)
                   ((long)&plVar28[uVar20 * (int)uVar8 + (int)((ulong)uVar8 >> 0x20)].
                           super__List_base<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>
                           ._M_impl._M_node + 0x10);
          *psVar1 = *psVar1 + 1;
          plVar28 = *(pointer *)
                     &(plVar27->
                      super__List_base<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>
                      )._M_impl._M_node;
          psVar1 = (size_t *)
                   ((long)&(local_c0->
                           super__List_base<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>
                           )._M_impl._M_node + 0x10);
          *psVar1 = *psVar1 - 1;
          std::__detail::_List_node_base::_M_unhook();
          operator_delete(plVar27,0x18);
          goto LAB_00133cec;
        }
      }
      pHVar18 = (local_f0->
                super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pHVar9 = (local_f0->
               super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (pHVar18 != pHVar9) {
        uVar20 = *(uint *)(*(long *)(sVar5 + 0x10) + 8);
        uVar4 = *(uint *)(*(long *)(sVar5 + 0x10) + 0xc);
        uVar13 = uVar4 + 0x3f;
        if (-1 < (int)uVar4) {
          uVar13 = uVar4;
        }
        bVar11 = (byte)uVar4 & 0x3f;
        do {
          iVar21 = 3;
          if ((pHVar18->fixed == false) && (iVar21 = 0, pHVar18->v == uVar20)) {
            if ((pHVar18->values).n_words < 0x11) {
              pSVar22 = &pHVar18->values;
            }
            else {
              pSVar22 = (SVOBitset *)(pHVar18->values)._data.short_data[0];
            }
            iVar21 = 2;
            if (((pSVar22->_data).short_data[(int)uVar13 >> 6] & 1L << ((ulong)uVar4 & 0x3f)) != 0)
            {
              (pSVar22->_data).short_data[(int)uVar13 >> 6] =
                   (pSVar22->_data).short_data[(int)uVar13 >> 6] &
                   (-2L << bVar11 | 0xfffffffffffffffeU >> 0x40 - bVar11);
              puVar2 = &pHVar18->count;
              *puVar2 = *puVar2 - 1;
              bVar14 = bVar30;
              if (*puVar2 == 0) {
                bVar30 = true;
                bVar14 = true;
              }
            }
          }
        } while (((iVar21 == 3) || (iVar21 == 0)) && (pHVar18 = pHVar18 + 1, pHVar18 != pHVar9));
      }
      plVar28 = *(pointer *)
                 &(plVar27->
                  super__List_base<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>
                  )._M_impl._M_node;
LAB_00133cec:
      plVar27 = plVar28;
    } while (plVar28 != local_c0);
    this = local_c8;
    if (!bVar14) goto LAB_00133d18;
    bVar14 = false;
    pHVar15 = local_d0;
  }
  else {
LAB_00133d18:
    bVar14 = propagate_simple_constraints(this,local_f0,&local_b8._M_value);
    pHVar15 = local_d0;
    if (bVar14) {
LAB_00133d33:
      bVar14 = HomomorphismModel::has_less_thans(this->model);
      if ((((!bVar14) || (bVar14 = propagate_less_thans(this,local_f0), bVar14)) &&
          ((bVar14 = HomomorphismModel::has_occur_less_thans(this->model), !bVar14 ||
           (bVar14 = propagate_occur_less_thans
                               (this,(optional<gss::innards::HomomorphismAssignment> *)
                                     &local_b8._M_value,assignments,local_f0), bVar14)))) &&
         ((this->params->injectivity != Injective ||
          (bVar14 = cheap_all_different(this->model->target_size,local_f0,
                                        (shared_ptr<gss::innards::Proof> *)local_a0,this->model),
          bVar14)))) {
        pHVar15 = (pointer)CONCAT71((int7)((ulong)pHVar15 >> 8),1);
        bVar14 = true;
        goto LAB_00133da1;
      }
    }
    bVar14 = false;
  }
LAB_00133da1:
  if (!bVar14) {
    return false;
  }
  pHVar18 = (local_f0->
            super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pHVar9 = (local_f0->
           super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar24 = ((long)pHVar9 - (long)pHVar18 >> 3) * -0x79435e50d79435e5 >> 2;
  pHVar19 = pHVar18;
  if (0 < lVar24) {
    pHVar19 = pHVar18 + lVar24 * 4;
    lVar24 = lVar24 + 1;
    pHVar18 = pHVar18 + 2;
    do {
      if ((pHVar18[-2].fixed == false) && (pHVar18[-2].count == 1)) {
        pHVar18 = pHVar18 + -2;
        goto LAB_00133eba;
      }
      if ((pHVar18[-1].fixed == false) && (pHVar18[-1].count == 1)) {
        pHVar18 = pHVar18 + -1;
        goto LAB_00133eba;
      }
      if ((pHVar18->fixed == false) && (pHVar18->count == 1)) goto LAB_00133eba;
      if ((pHVar18[1].fixed == false) && (pHVar18[1].count == 1)) {
        pHVar18 = pHVar18 + 1;
        goto LAB_00133eba;
      }
      lVar24 = lVar24 + -1;
      pHVar18 = pHVar18 + 4;
    } while (1 < lVar24);
  }
  lVar24 = ((long)pHVar9 - (long)pHVar19 >> 3) * -0x79435e50d79435e5;
  if (lVar24 != 1) {
    if (lVar24 != 2) {
      pHVar18 = pHVar9;
      if ((lVar24 != 3) || ((pHVar19->fixed == false && (pHVar18 = pHVar19, pHVar19->count == 1))))
      goto LAB_00133eba;
      pHVar19 = pHVar19 + 1;
    }
    if ((pHVar19->fixed == false) && (pHVar18 = pHVar19, pHVar19->count == 1)) goto LAB_00133eba;
    pHVar19 = pHVar19 + 1;
  }
  pHVar18 = pHVar19;
  if (pHVar19->count != 1) {
    pHVar18 = pHVar9;
  }
  if (pHVar19->fixed != false) {
    pHVar18 = pHVar9;
  }
LAB_00133eba:
  bVar14 = pHVar18 ==
           (local_f0->
           super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if ((bVar14 & (byte)pHVar15) == 1) goto code_r0x00133ed4;
  goto LAB_001339a9;
code_r0x00133ed4:
  local_8c = 0;
  if ((this->params->lackey)._M_t.
      super___uniq_ptr_impl<gss::innards::Lackey,_std::default_delete<gss::innards::Lackey>_>._M_t.
      super__Tuple_impl<0UL,_gss::innards::Lackey_*,_std::default_delete<gss::innards::Lackey>_>.
      super__Head_base<0UL,_gss::innards::Lackey_*,_false>._M_head_impl == (Lackey *)0x0) {
    return true;
  }
  if (((char)local_d4 == '\0') && (this->params->send_partials_to_lackey != true)) {
    return true;
  }
  local_48._M_allocated_capacity = (size_type)&_Stack_58;
  _Stack_58 = _S_red;
  uStack_50 = 0;
  uStack_4c = 0;
  local_38 = 0;
  pHVar15 = (assignments->values).
            super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pHVar10 = (assignments->values).
            super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_48._8_8_ = local_48._M_allocated_capacity;
  if (pHVar15 != pHVar10) {
    do {
      std::
      _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
      ::_M_emplace_unique<unsigned_int_const&,unsigned_int_const&>
                ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                  *)&local_60._M_value,(uint *)pHVar15,&(pHVar15->assignment).target_vertex);
      pHVar15 = pHVar15 + 1;
    } while (pHVar15 != pHVar10);
  }
  if ((char)local_d4 == '\0') {
    local_88._M_unused._M_object = (long *)0x0;
    local_88._8_8_ = 0;
    pcStack_78 = (code *)0x0;
    apcStack_70[0] = (code *)0x0;
    bVar14 = Lackey::check_solution
                       ((this->params->lackey)._M_t.
                        super___uniq_ptr_impl<gss::innards::Lackey,_std::default_delete<gss::innards::Lackey>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_gss::innards::Lackey_*,_std::default_delete<gss::innards::Lackey>_>
                        .super__Head_base<0UL,_gss::innards::Lackey_*,_false>._M_head_impl,
                        (VertexToVertexMapping *)&local_60._M_value,true,false,
                        (function<bool_(int,_int)> *)&local_88);
    if (pcStack_78 != (code *)0x0) {
      (*pcStack_78)(&local_88,&local_88,__destroy_functor);
    }
    if (!bVar14) goto LAB_001340d7;
  }
  else {
    local_f2 = 0;
    local_88._0_4_ = 0xffffffff;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_b8._M_value,
               (ulong)this->model->pattern_size,(value_type_conflict1 *)local_88._M_pod_data,
               &local_e1);
    pHVar18 = (local_f0->
              super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
              )._M_impl.super__Vector_impl_data._M_start;
    lVar24 = (long)(local_f0->
                   super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pHVar18;
    if (lVar24 != 0) {
      uVar23 = (lVar24 >> 3) * -0x79435e50d79435e5;
      uVar25 = 0;
      do {
        *(int *)((long)local_b8 + (ulong)pHVar18->v * 4) = (int)uVar25;
        uVar25 = (ulong)((int)uVar25 + 1);
        pHVar18 = pHVar18 + 1;
      } while (uVar25 <= uVar23 && uVar23 - uVar25 != 0);
    }
    this_01 = (this->params->lackey)._M_t.
              super___uniq_ptr_impl<gss::innards::Lackey,_std::default_delete<gss::innards::Lackey>_>
              ._M_t.
              super__Tuple_impl<0UL,_gss::innards::Lackey_*,_std::default_delete<gss::innards::Lackey>_>
              .super__Head_base<0UL,_gss::innards::Lackey_*,_false>._M_head_impl;
    local_88._M_unused._M_object = (void *)0x0;
    local_88._8_8_ = 0;
    pcStack_78 = (code *)0x0;
    apcStack_70[0] = (code *)0x0;
    local_88._M_unused._M_object = operator_new(0x20);
    *(byte **)local_88._M_unused._0_8_ = &local_f2;
    *(_Storage<gss::innards::HomomorphismAssignment,_true> **)((long)local_88._M_unused._0_8_ + 8) =
         &local_b8;
    *(Domains **)((long)local_88._M_unused._0_8_ + 0x10) = local_f0;
    *(undefined4 **)((long)local_88._M_unused._0_8_ + 0x18) = &local_8c;
    apcStack_70[0] =
         std::
         _Function_handler<bool_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/innards/homomorphism_searcher.cc:840:29)>
         ::_M_invoke;
    pcStack_78 = std::
                 _Function_handler<bool_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/innards/homomorphism_searcher.cc:840:29)>
                 ::_M_manager;
    bVar14 = Lackey::check_solution
                       (this_01,(VertexToVertexMapping *)&local_60._M_value,true,false,
                        (function<bool_(int,_int)> *)&local_88);
    bVar11 = local_f2;
    if (pcStack_78 != (code *)0x0) {
      (*pcStack_78)(&local_88,&local_88,__destroy_functor);
    }
    if (local_b8 != (_Storage<gss::innards::HomomorphismAssignment,_true>)0x0) {
      operator_delete((void *)local_b8,local_a8 - (long)local_b8);
    }
    if (!bVar14 || (bVar11 & 1) != 0) {
LAB_001340d7:
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                   *)&local_60._M_value);
      return false;
    }
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
               *)&local_60._M_value);
  return true;
}

Assistant:

auto HomomorphismSearcher::propagate(bool initial, Domains & new_domains, HomomorphismAssignments & assignments, bool propagate_using_lackey) -> bool
{
    // nogoods might be watching things in initial assignments. this is possibly not the
    // best place to put this...
    if (initial && might_have_watches(params)) {
        for (auto & a : assignments.values) {
            HomomorphismAssignment current_assignment = {a.assignment.pattern_vertex, a.assignment.target_vertex};
            bool wipeout = false;
            watches.propagate(
                current_assignment,
                [&](const HomomorphismAssignment & a) { return ! assignments.contains(a); },
                [&](const HomomorphismAssignment & a) {
                    for (auto & d : new_domains) {
                        if (d.v == a.pattern_vertex) {
                            if (d.values.test(a.target_vertex)) {
                                d.values.reset(a.target_vertex);
                                if (0 == --d.count)
                                    wipeout = true;
                            }
                            break;
                        }
                    }
                });

            if (wipeout)
                return false;
        }
    }

    auto find_unit_domain = [&]() {
        return find_if(new_domains.begin(), new_domains.end(), [](HomomorphismDomain & d) {
            return (! d.fixed) && 1 == d.count;
        });
    };

    bool done_globals_at_least_once = false;

    // whilst we've got a unit domain...
    for (typename Domains::iterator branch_domain = find_unit_domain();
         branch_domain != new_domains.end() || ! done_globals_at_least_once;
         branch_domain = find_unit_domain()) {
        optional<HomomorphismAssignment> current_assignment;
        if (branch_domain != new_domains.end()) {
            // what are we assigning?
            current_assignment = HomomorphismAssignment{branch_domain->v, unsigned(branch_domain->values.find_first())};

            // ok, make the assignment
            branch_domain->fixed = true;
            assignments.values.push_back({*current_assignment, false, -1, -1});

            if (proof)
                proof->unit_propagating(
                    model.pattern_vertex_for_proof(current_assignment->pattern_vertex),
                    model.target_vertex_for_proof(current_assignment->target_vertex));

            // propagate watches
            if (might_have_watches(params)) {
                bool wipeout = false;
                watches.propagate(
                    *current_assignment,
                    [&](const HomomorphismAssignment & a) { return ! assignments.contains(a); },
                    [&](const HomomorphismAssignment & a) {
                        for (auto & d : new_domains) {
                            if (d.fixed)
                                continue;

                            if (d.v == a.pattern_vertex) {
                                if (d.values.test(a.target_vertex)) {
                                    d.values.reset(a.target_vertex);
                                    if (0 == --d.count)
                                        wipeout = true;
                                }
                                break;
                            }
                        }
                    });

                if (wipeout)
                    return false;
            }

            // propagate simple all different and adjacency
            if (! propagate_simple_constraints(new_domains, *current_assignment))
                return false;
        }

        // propagate less thans
        if (model.has_less_thans() && ! propagate_less_thans(new_domains))
            return false;
        if (model.has_occur_less_thans() && ! propagate_occur_less_thans(current_assignment, assignments, new_domains))
            return false;

        // propagate all different
        if (params.injectivity == Injectivity::Injective)
            if (! cheap_all_different(model.target_size, new_domains, proof, &model))
                return false;
        done_globals_at_least_once = true;
    }

    int dcount = 0;
    if (params.lackey && (propagate_using_lackey || params.send_partials_to_lackey)) {
        VertexToVertexMapping mapping;
        expand_to_full_result(assignments, mapping);

        if (! propagate_using_lackey) {
            if (! params.lackey->check_solution(mapping, true, false, Lackey::DeletionFunction{}))
                return false;
        }
        else {
            bool wipeout = false;
            vector<int> find_domain(model.pattern_size, -1);
            for (unsigned i = 0; i < new_domains.size(); ++i)
                find_domain[new_domains[i].v] = i;

            auto deletion = [&](int p, int t) -> bool {
                if (! wipeout) {
                    if (int d = find_domain[p]; d != -1) {
                        if (new_domains[d].values.test(t)) {
                            ++dcount;
                            new_domains[d].values.reset(t);
                            if (0 == --new_domains[d].count)
                                wipeout = true;
                            return true;
                        }
                    }
                }
                return false;
            };

            if (! params.lackey->check_solution(mapping, true, false, deletion) || wipeout)
                return false;
        }
    }

    return true;
}